

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSExporter::Discreet3DSExporter
          (Discreet3DSExporter *this,shared_ptr<Assimp::IOStream> *outfile,aiScene *scene)

{
  StreamWriterLE *this_00;
  _Rb_tree_header *p_Var1;
  ChunkWriter chunk_1;
  ChunkWriter chunk_2;
  ChunkWriter chunk;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this->scene = scene;
  this_00 = &this->writer;
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&outfile->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  StreamWriter<false,_false>::StreamWriter(this_00,(shared_ptr<Assimp::IOStream> *)&local_38,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  p_Var1 = &(this->trafos)._M_t._M_impl.super__Rb_tree_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->meshes)._M_t._M_impl.super__Rb_tree_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  anon_unknown_0::CollectTrafos(scene->mRootNode,&this->trafos);
  anon_unknown_0::CollectMeshes(scene->mRootNode,&this->meshes);
  anon_unknown_0::ChunkWriter::ChunkWriter(&chunk,this_00,0x4d4d);
  anon_unknown_0::ChunkWriter::ChunkWriter(&chunk_1,this_00,0x3d3d);
  WriteMaterials(this);
  WriteMeshes(this);
  anon_unknown_0::ChunkWriter::ChunkWriter(&chunk_2,this_00,0x100);
  StreamWriter<false,_false>::Put<float>(this_00,1.0);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk_2);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk_1);
  anon_unknown_0::ChunkWriter::ChunkWriter(&chunk_1,this_00,0xb000);
  WriteHierarchy(this,scene->mRootNode,-1,-1);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk_1);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk);
  return;
}

Assistant:

Discreet3DSExporter:: Discreet3DSExporter(std::shared_ptr<IOStream> &outfile, const aiScene* scene)
: scene(scene)
, writer(outfile)
{
    CollectTrafos(scene->mRootNode, trafos);
    CollectMeshes(scene->mRootNode, meshes);

    ChunkWriter chunk(writer, Discreet3DS::CHUNK_MAIN);

    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_OBJMESH);
        WriteMaterials();
        WriteMeshes();

        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_MASTER_SCALE);
            writer.PutF4(1.0f);
        }
    }

    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_KEYFRAMER);
        WriteHierarchy(*scene->mRootNode, -1, -1);
    }
}